

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes_decoder.cc
# Opt level: O0

bool __thiscall
draco::AttributesDecoder::DecodeAttributesDecoderData
          (AttributesDecoder *this,DecoderBuffer *in_buffer)

{
  bool bVar1;
  uint16_t uVar2;
  int32_t iVar3;
  ulong uVar4;
  int64_t iVar5;
  PointAttribute *this_00;
  Type *pTVar6;
  size_type sVar7;
  uint *puVar8;
  DecoderBuffer *in_RSI;
  long in_RDI;
  pointer __p;
  int att_id;
  uint16_t custom_id;
  uint32_t unique_id;
  GeometryAttribute ga;
  DataType draco_dt;
  uint8_t normalized;
  uint8_t num_components;
  uint8_t data_type;
  uint8_t att_type;
  uint32_t i;
  PointCloud *pc;
  uint32_t num_attributes;
  uint *in_stack_fffffffffffffef8;
  PointCloud *in_stack_ffffffffffffff00;
  DataType in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  Type in_stack_ffffffffffffff18;
  Type in_stack_ffffffffffffff1c;
  PointAttribute *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  Type in_stack_ffffffffffffff2c;
  unique_ptr<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
  in_stack_ffffffffffffff30;
  void *in_stack_ffffffffffffff38;
  PointAttribute local_90;
  uint local_1c;
  DecoderBuffer *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 0x38));
  if (uVar2 < 0x200) {
    bVar1 = DecoderBuffer::Decode<unsigned_int>
                      ((DecoderBuffer *)
                       CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                       (uint *)in_stack_ffffffffffffff00);
    if (!bVar1) {
      return false;
    }
  }
  else {
    bVar1 = DecodeVarint<unsigned_int>(in_stack_fffffffffffffef8,(DecoderBuffer *)0x20f824);
    if (!bVar1) {
      return false;
    }
  }
  if (local_1c == 0) {
    local_1 = false;
  }
  else {
    uVar4 = (ulong)local_1c;
    iVar5 = DecoderBuffer::remaining_size(local_18);
    if (uVar4 == iVar5 * 5 || SBORROW8(uVar4,iVar5 * 5) != (long)(uVar4 + iVar5 * -5) < 0) {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      local_90.attribute_transform_data_._M_t.
      super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
      ._M_t.
      super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
      .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl =
           *(__uniq_ptr_data<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>,_true,_true>
             *)&((__uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
                  *)(in_RDI + 0x40))->_M_t;
      for (local_90._100_4_ = 0; (uint)local_90._100_4_ < local_1c;
          local_90._100_4_ = local_90._100_4_ + 1) {
        bVar1 = DecoderBuffer::Decode<unsigned_char>
                          ((DecoderBuffer *)
                           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           (uchar *)in_stack_ffffffffffffff00);
        if (!bVar1) {
          return false;
        }
        bVar1 = DecoderBuffer::Decode<unsigned_char>
                          ((DecoderBuffer *)
                           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           (uchar *)in_stack_ffffffffffffff00);
        if (!bVar1) {
          return false;
        }
        bVar1 = DecoderBuffer::Decode<unsigned_char>
                          ((DecoderBuffer *)
                           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           (uchar *)in_stack_ffffffffffffff00);
        if (!bVar1) {
          return false;
        }
        bVar1 = DecoderBuffer::Decode<unsigned_char>
                          ((DecoderBuffer *)
                           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           (uchar *)in_stack_ffffffffffffff00);
        if (!bVar1) {
          return false;
        }
        if (4 < local_90.num_unique_entries_._3_1_) {
          return false;
        }
        if ((local_90.num_unique_entries_._2_1_ == 0) || (0xb < local_90.num_unique_entries_._2_1_))
        {
          return false;
        }
        if (local_90.num_unique_entries_._1_1_ == 0) {
          return false;
        }
        local_90.indices_map_.vector_.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             (DataType)local_90.num_unique_entries_._2_1_;
        GeometryAttribute::GeometryAttribute((GeometryAttribute *)in_stack_ffffffffffffff00);
        iVar3 = DataTypeLength(local_90.indices_map_.vector_.
                               super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        __p = (pointer)(long)(int)(iVar3 * (uint)local_90.num_unique_entries_._1_1_);
        in_stack_ffffffffffffff00 = (PointCloud *)0x0;
        GeometryAttribute::Init
                  (&in_stack_ffffffffffffff20->super_GeometryAttribute,in_stack_ffffffffffffff1c,
                   (DataBuffer *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   (uint8_t)((uint)in_stack_ffffffffffffff0c >> 0x18),in_stack_ffffffffffffff08,
                   false,(int64_t)in_stack_ffffffffffffff30._M_t.
                                  super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
                                  .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>.
                                  _M_head_impl,(int64_t)in_stack_ffffffffffffff38);
        uVar2 = PointCloudDecoder::bitstream_version(*(PointCloudDecoder **)(in_RDI + 0x38));
        if (uVar2 < 0x103) {
          bVar1 = DecoderBuffer::Decode<unsigned_short>
                            ((DecoderBuffer *)
                             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                             (unsigned_short *)in_stack_ffffffffffffff00);
          if (!bVar1) {
            return false;
          }
          local_90.super_GeometryAttribute.buffer_descriptor_.buffer_update_count._4_4_ =
               (uint)local_90.super_GeometryAttribute.buffer_descriptor_.buffer_update_count._2_2_;
          GeometryAttribute::set_unique_id
                    ((GeometryAttribute *)&local_90.super_GeometryAttribute.num_components_,
                     local_90.super_GeometryAttribute.buffer_descriptor_.buffer_update_count._4_4_);
        }
        else {
          bVar1 = DecodeVarint<unsigned_int>((uint *)__p,(DecoderBuffer *)0x20fae0);
          if (!bVar1) {
            return false;
          }
          GeometryAttribute::set_unique_id
                    ((GeometryAttribute *)&local_90.super_GeometryAttribute.num_components_,
                     local_90.super_GeometryAttribute.buffer_descriptor_.buffer_update_count._4_4_);
        }
        in_stack_ffffffffffffff30._M_t.
        super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
        ._M_t.
        super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
        .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl =
             (__uniq_ptr_data<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>,_true,_true>
              )(__uniq_ptr_data<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>,_true,_true>
                )local_90.attribute_transform_data_;
        in_stack_ffffffffffffff38 = operator_new(0x70);
        PointAttribute::PointAttribute
                  (in_stack_ffffffffffffff20,
                   (GeometryAttribute *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
        in_stack_ffffffffffffff20 = &local_90;
        std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>::
        unique_ptr<std::default_delete<draco::PointAttribute>,void>
                  ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *
                   )in_stack_ffffffffffffff00,__p);
        iVar3 = (int32_t)((ulong)__p >> 0x20);
        in_stack_ffffffffffffff2c =
             PointCloud::AddAttribute
                       ((PointCloud *)
                        in_stack_ffffffffffffff30._M_t.
                        super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
                        .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl,
                        (unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                         *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
        ~unique_ptr((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                     *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        local_90.super_GeometryAttribute.buffer_descriptor_.buffer_id._4_4_ =
             in_stack_ffffffffffffff2c;
        this_00 = PointCloud::attribute(in_stack_ffffffffffffff00,iVar3);
        GeometryAttribute::set_unique_id
                  (&this_00->super_GeometryAttribute,
                   local_90.super_GeometryAttribute.buffer_descriptor_.buffer_update_count._4_4_);
        in_stack_ffffffffffffff18 =
             local_90.super_GeometryAttribute.buffer_descriptor_.buffer_id._4_4_;
        pTVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),
                            (ulong)(uint)local_90._100_4_);
        *pTVar6 = in_stack_ffffffffffffff18;
        in_stack_ffffffffffffff1c =
             local_90.super_GeometryAttribute.buffer_descriptor_.buffer_id._4_4_;
        sVar7 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20));
        if ((Type)sVar7 <= in_stack_ffffffffffffff1c) {
          std::vector<int,_std::allocator<int>_>::resize
                    ((vector<int,_std::allocator<int>_> *)
                     in_stack_ffffffffffffff30._M_t.
                     super___uniq_ptr_impl<draco::AttributeTransformData,_std::default_delete<draco::AttributeTransformData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_draco::AttributeTransformData_*,_std::default_delete<draco::AttributeTransformData>_>
                     .super__Head_base<0UL,_draco::AttributeTransformData_*,_false>._M_head_impl,
                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                     (value_type_conflict1 *)in_stack_ffffffffffffff20);
        }
        in_stack_ffffffffffffff14 = local_90._100_4_;
        puVar8 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x20),
                                    (long)local_90.super_GeometryAttribute.buffer_descriptor_.
                                          buffer_id._4_4_);
        *puVar8 = in_stack_ffffffffffffff14;
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool AttributesDecoder::DecodeAttributesDecoderData(DecoderBuffer *in_buffer) {
  // Decode and create attributes.
  uint32_t num_attributes;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
  if (point_cloud_decoder_->bitstream_version() <
      DRACO_BITSTREAM_VERSION(2, 0)) {
    if (!in_buffer->Decode(&num_attributes)) {
      return false;
    }
  } else
#endif
  {
    if (!DecodeVarint(&num_attributes, in_buffer)) {
      return false;
    }
  }

  // Check that decoded number of attributes is valid.
  if (num_attributes == 0) {
    return false;
  }
  if (num_attributes > 5 * in_buffer->remaining_size()) {
    // The decoded number of attributes is unreasonably high, because at least
    // five bytes of attribute descriptor data per attribute are expected.
    return false;
  }

  // Decode attribute descriptor data.
  point_attribute_ids_.resize(num_attributes);
  PointCloud *pc = point_cloud_;
  for (uint32_t i = 0; i < num_attributes; ++i) {
    // Decode attribute descriptor data.
    uint8_t att_type, data_type, num_components, normalized;
    if (!in_buffer->Decode(&att_type)) {
      return false;
    }
    if (!in_buffer->Decode(&data_type)) {
      return false;
    }
    if (!in_buffer->Decode(&num_components)) {
      return false;
    }
    if (!in_buffer->Decode(&normalized)) {
      return false;
    }
    if (att_type >= GeometryAttribute::NAMED_ATTRIBUTES_COUNT) {
      return false;
    }
    if (data_type == DT_INVALID || data_type >= DT_TYPES_COUNT) {
      return false;
    }

    // Check decoded attribute descriptor data.
    if (num_components == 0) {
      return false;
    }

    // Add the attribute to the point cloud.
    const DataType draco_dt = static_cast<DataType>(data_type);
    GeometryAttribute ga;
    ga.Init(static_cast<GeometryAttribute::Type>(att_type), nullptr,
            num_components, draco_dt, normalized > 0,
            DataTypeLength(draco_dt) * num_components, 0);
    uint32_t unique_id;
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
    if (point_cloud_decoder_->bitstream_version() <
        DRACO_BITSTREAM_VERSION(1, 3)) {
      uint16_t custom_id;
      if (!in_buffer->Decode(&custom_id)) {
        return false;
      }
      // TODO(draco-eng): Add "custom_id" to attribute metadata.
      unique_id = static_cast<uint32_t>(custom_id);
      ga.set_unique_id(unique_id);
    } else
#endif
    {
      if (!DecodeVarint(&unique_id, in_buffer)) {
        return false;
      }
      ga.set_unique_id(unique_id);
    }
    const int att_id = pc->AddAttribute(
        std::unique_ptr<PointAttribute>(new PointAttribute(ga)));
    pc->attribute(att_id)->set_unique_id(unique_id);
    point_attribute_ids_[i] = att_id;

    // Update the inverse map.
    if (att_id >=
        static_cast<int32_t>(point_attribute_to_local_id_map_.size())) {
      point_attribute_to_local_id_map_.resize(att_id + 1, -1);
    }
    point_attribute_to_local_id_map_[att_id] = i;
  }
  return true;
}